

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

void Cof_ManInsertEntry_rec(Vec_Ptr_t *vNodes,Cof_Obj_t *pNode,int nNodeMax)

{
  uint uVar1;
  Cof_Obj_t *pCVar2;
  uint uVar3;
  void **ppvVar4;
  int iVar5;
  
  iVar5 = vNodes->nSize;
  if (iVar5 == 0) {
    if (vNodes->nCap != 0) goto LAB_0070c0df;
    if (vNodes->pArray == (void **)0x0) {
      ppvVar4 = (void **)malloc(0x80);
    }
    else {
      ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
    }
    vNodes->pArray = ppvVar4;
    iVar5 = 0x10;
  }
  else {
    if (iVar5 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    ppvVar4 = vNodes->pArray;
    uVar3 = iVar5 - 1;
    vNodes->nSize = uVar3;
    pCVar2 = (Cof_Obj_t *)ppvVar4[uVar3];
    if (*(uint *)pCVar2 >> 8 < *(uint *)pNode >> 8) {
      Cof_ManInsertEntry_rec(vNodes,pNode,nNodeMax);
      if (nNodeMax <= vNodes->nSize) {
        return;
      }
      uVar3 = vNodes->nCap;
      pNode = pCVar2;
      if (vNodes->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
          }
          iVar5 = 0x10;
        }
        else {
          iVar5 = uVar3 * 2;
          if (iVar5 <= (int)uVar3) goto LAB_0070c0df;
          if (vNodes->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar3 << 4);
          }
        }
        vNodes->pArray = ppvVar4;
        vNodes->nCap = iVar5;
      }
      goto LAB_0070c0df;
    }
    uVar1 = vNodes->nCap;
    if (uVar3 == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (ppvVar4 == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(ppvVar4,0x80);
        }
        iVar5 = 0x10;
      }
      else {
        iVar5 = uVar1 * 2;
        if (iVar5 <= (int)uVar1) goto LAB_0070c032;
        if (ppvVar4 == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar1 << 4);
        }
      }
      vNodes->pArray = ppvVar4;
      vNodes->nCap = iVar5;
    }
LAB_0070c032:
    iVar5 = vNodes->nSize;
    uVar3 = iVar5 + 1;
    vNodes->nSize = uVar3;
    vNodes->pArray[iVar5] = pCVar2;
    if (nNodeMax <= (int)uVar3) {
      return;
    }
    uVar1 = vNodes->nCap;
    if (uVar3 != uVar1) goto LAB_0070c0df;
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
      }
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_0070c0df;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
    }
    vNodes->pArray = ppvVar4;
  }
  vNodes->nCap = iVar5;
LAB_0070c0df:
  iVar5 = vNodes->nSize;
  vNodes->nSize = iVar5 + 1;
  vNodes->pArray[iVar5] = pNode;
  return;
}

Assistant:

void Cof_ManInsertEntry_rec( Vec_Ptr_t * vNodes, Cof_Obj_t * pNode, int nNodeMax )
{
    Cof_Obj_t * pLast;
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrPush(vNodes, pNode);
        return;
    }
    pLast = (Cof_Obj_t *)Vec_PtrPop(vNodes);
    if ( Cof_ObjFanoutNum(pLast) < Cof_ObjFanoutNum(pNode) )
    {
        Cof_ManInsertEntry_rec( vNodes, pNode, nNodeMax );
        if ( Vec_PtrSize(vNodes) < nNodeMax )
            Vec_PtrPush( vNodes, pLast );
    }
    else
    {
        Vec_PtrPush( vNodes, pLast );
        if ( Vec_PtrSize(vNodes) < nNodeMax )
            Vec_PtrPush( vNodes, pNode );
    }
}